

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseUnqualifiedName(Db *this,NameState *State)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  Node **ppNVar4;
  char *pcVar5;
  Node *pNVar6;
  size_t sVar8;
  NameState *pNVar9;
  bool bVar10;
  bool bVar11;
  NodeArray NVar12;
  Node NVar13;
  Node *local_40;
  size_t local_38;
  Node **ppNVar7;
  
  psVar2 = (short *)this->First;
  psVar3 = (short *)this->Last;
  if (psVar3 != psVar2) {
    if ((char)*psVar2 == 'U') {
      if (((ulong)((long)psVar3 - (long)psVar2) < 2) || (*psVar2 != 0x7455)) {
        psVar2 = (short *)this->First;
        if ((1 < (ulong)((long)psVar3 - (long)psVar2)) && (*psVar2 == 0x6c55)) {
          psVar1 = psVar2 + 1;
          this->First = (char *)psVar1;
          bVar10 = this->ParsingLambdaParams;
          this->ParsingLambdaParams = true;
          if (((ulong)((long)psVar3 - (long)psVar1) < 2) || (*psVar1 != 0x4576)) {
            ppNVar7 = (this->Names).Last;
            ppNVar4 = (this->Names).First;
            local_40 = parseType(this);
            bVar11 = local_40 == (Node *)0x0;
            if (!bVar11) {
              do {
                PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                          (&this->Names,&local_40);
                pcVar5 = this->First;
                if ((pcVar5 != this->Last) && (*pcVar5 == 'E')) {
                  this->First = pcVar5 + 1;
                  NVar12 = popTrailingNodeArray(this,(long)ppNVar7 - (long)ppNVar4 >> 3);
                  ppNVar7 = NVar12.Elements;
                  goto LAB_0019abce;
                }
                local_40 = parseType(this);
                bVar11 = local_40 == (Node *)0x0;
              } while (!bVar11);
            }
            NVar12.NumElements = 0;
            NVar12.Elements = (Node **)local_40;
            ppNVar7 = (Node **)0x0;
LAB_0019abce:
            sVar8 = NVar12.NumElements;
            if (!bVar11) goto LAB_0019abe2;
LAB_0019ac4a:
            pNVar6 = (Node *)0x0;
          }
          else {
            this->First = (char *)(psVar2 + 2);
            sVar8 = 0;
            ppNVar7 = (Node **)0x0;
LAB_0019abe2:
            pNVar6 = (Node *)0x0;
            local_38 = sVar8;
            NVar13 = (Node)parseNumber(this,false);
            pcVar5 = this->First;
            if (pcVar5 != this->Last) {
              if (*pcVar5 != '_') goto LAB_0019ac4a;
              this->First = pcVar5 + 1;
              pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
              pNVar6->K = KClosureTypeName;
              pNVar6->RHSComponentCache = No;
              pNVar6->ArrayCache = No;
              pNVar6->FunctionCache = No;
              pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb470;
              pNVar6[1]._vptr_Node = (_func_int **)ppNVar7;
              pNVar6[1].K = (undefined1)local_38;
              pNVar6[1].RHSComponentCache = local_38._1_1_;
              pNVar6[1].ArrayCache = local_38._2_1_;
              pNVar6[1].FunctionCache = local_38._3_1_;
              *(undefined4 *)&pNVar6[1].field_0xc = local_38._4_4_;
              pNVar6[2] = NVar13;
            }
          }
          this->ParsingLambdaParams = bVar10;
          goto LAB_0019a9dd;
        }
      }
      else {
        this->First = (char *)(psVar2 + 1);
        pNVar6 = (Node *)0x0;
        NVar13 = (Node)parseNumber(this,false);
        pcVar5 = this->First;
        if (pcVar5 == this->Last) goto LAB_0019a9dd;
        if (*pcVar5 == '_') {
          this->First = pcVar5 + 1;
          pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar6->K = KUnnamedTypeName;
          pNVar6->RHSComponentCache = No;
          pNVar6->ArrayCache = No;
          pNVar6->FunctionCache = No;
          pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb418;
          pNVar6[1] = NVar13;
          goto LAB_0019a9dd;
        }
      }
      pNVar6 = (Node *)0x0;
      goto LAB_0019a9dd;
    }
    if ((byte)((char)*psVar2 - 0x31U) < 9) {
      pNVar6 = parseSourceName(this,State);
      goto LAB_0019a9dd;
    }
  }
  if (((ulong)((long)psVar3 - (long)psVar2) < 2) || (*psVar2 != 0x4344)) {
    pNVar6 = parseOperatorName(this,State);
  }
  else {
    this->First = (char *)(psVar2 + 1);
    pNVar6 = (Node *)((long)(this->Names).Last - (long)(this->Names).First);
    local_40 = parseSourceName(this,State);
    bVar10 = local_40 == (Node *)0x0;
    if (!bVar10) {
      pNVar6 = (Node *)((long)pNVar6 >> 3);
      do {
        pNVar9 = (NameState *)&local_40;
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_40);
        pcVar5 = this->First;
        if ((pcVar5 != this->Last) && (*pcVar5 == 'E')) {
          this->First = pcVar5 + 1;
          NVar13 = (Node)popTrailingNodeArray(this,(size_t)pNVar6);
          pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar6->K = KStructuredBindingName;
          pNVar6->RHSComponentCache = No;
          pNVar6->ArrayCache = No;
          pNVar6->FunctionCache = No;
          pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb4c8;
          pNVar6[1] = NVar13;
          break;
        }
        local_40 = parseSourceName(this,pNVar9);
        bVar10 = local_40 == (Node *)0x0;
      } while (!bVar10);
    }
    if (bVar10) {
      return (Node *)0x0;
    }
  }
LAB_0019a9dd:
  if (pNVar6 == (Node *)0x0) {
    return (Node *)0x0;
  }
  pNVar6 = parseAbiTags(this,pNVar6);
  return pNVar6;
}

Assistant:

Node *Db::parseUnqualifiedName(NameState *State) {
 // <ctor-dtor-name>s are special-cased in parseNestedName().
 Node *Result;
 if (look() == 'U')
   Result = parseUnnamedTypeName(State);
 else if (look() >= '1' && look() <= '9')
   Result = parseSourceName(State);
 else if (consumeIf("DC")) {
   size_t BindingsBegin = Names.size();
   do {
     Node *Binding = parseSourceName(State);
     if (Binding == nullptr)
       return nullptr;
     Names.push_back(Binding);
   } while (!consumeIf('E'));
   Result = make<StructuredBindingName>(popTrailingNodeArray(BindingsBegin));
 } else
   Result = parseOperatorName(State);
 if (Result != nullptr)
   Result = parseAbiTags(Result);
 return Result;
}